

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::b_formatter<spdlog::details::scoped_padder>::format
          (b_formatter<spdlog::details::scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  string_view_t view;
  const_reference ppcVar1;
  memory_buf_t *pmVar2;
  memory_buf_t *in_RDI;
  scoped_padder p;
  string_view_t field_value;
  size_type in_stack_ffffffffffffff58;
  array<const_char_*,_12UL> *in_stack_ffffffffffffff60;
  memory_buf_t *this_00;
  memory_buf_t *this_01;
  memory_buf_t *dest_00;
  char *in_stack_ffffffffffffff78;
  scoped_padder *in_stack_ffffffffffffff80;
  undefined1 local_40 [56];
  memory_buf_t *local_8;
  
  ppcVar1 = std::array<const_char_*,_12UL>::operator[]
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_40._48_8_ = *ppcVar1;
  this_00 = (memory_buf_t *)local_40;
  dest_00 = this_00;
  local_8 = this_00;
  pmVar2 = (memory_buf_t *)std::char_traits<char>::length((char_type *)0x1ecdab);
  this_01 = this_00;
  (dest_00->super_buffer<char>).ptr_ = (char *)pmVar2;
  fmt::v9::basic_string_view<char>::size((basic_string_view<char> *)this_00);
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,(padding_info *)in_RDI,
             dest_00);
  view.size_ = (size_t)in_stack_ffffffffffffff80;
  view.data_ = in_stack_ffffffffffffff78;
  fmt_helper::append_string_view(view,in_RDI);
  scoped_padder::~scoped_padder((scoped_padder *)this_01);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        string_view_t field_value{months[static_cast<size_t>(tm_time.tm_mon)]};
        ScopedPadder p(field_value.size(), padinfo_, dest);
        fmt_helper::append_string_view(field_value, dest);
    }